

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ulong uVar32;
  ulong uVar33;
  byte bVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  float fVar40;
  uint uVar41;
  float fVar43;
  float fVar45;
  vint4 bi;
  uint uVar44;
  uint uVar46;
  float fVar47;
  uint uVar48;
  undefined1 auVar42 [16];
  float fVar49;
  float fVar55;
  float fVar58;
  vint4 ai;
  uint uVar50;
  uint uVar51;
  uint uVar56;
  uint uVar57;
  uint uVar59;
  uint uVar60;
  float fVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint uVar64;
  float fVar65;
  uint uVar66;
  float fVar67;
  float fVar68;
  uint uVar69;
  float fVar70;
  float fVar71;
  vint4 ai_1;
  uint uVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 local_a28 [16];
  long local_a10;
  long local_a08;
  ulong local_a00;
  NodeRef *local_9f8;
  undefined1 (*local_9f0) [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  float local_888 [4];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  local_9f8 = stack + 1;
  stack[0] = root;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a00 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar37 = local_a00 ^ 0x10;
  iVar11 = (tray->tnear).field_0.i[k];
  iVar12 = (tray->tfar).field_0.i[k];
  local_9f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar39 = true;
  do {
    uVar33 = local_9f8[-1].ptr;
    local_9f8 = local_9f8 + -1;
    while ((uVar33 & 8) == 0) {
      pfVar1 = (float *)(uVar33 + 0x20 + local_a00);
      fVar40 = (*pfVar1 - fVar5) * fVar8;
      fVar43 = (pfVar1[1] - fVar5) * fVar8;
      fVar45 = (pfVar1[2] - fVar5) * fVar8;
      fVar47 = (pfVar1[3] - fVar5) * fVar8;
      pfVar1 = (float *)(uVar33 + 0x20 + uVar35);
      fVar49 = (*pfVar1 - fVar6) * fVar9;
      fVar55 = (pfVar1[1] - fVar6) * fVar9;
      fVar58 = (pfVar1[2] - fVar6) * fVar9;
      fVar61 = (pfVar1[3] - fVar6) * fVar9;
      uVar50 = (uint)((int)fVar49 < (int)fVar40) * (int)fVar40 |
               (uint)((int)fVar49 >= (int)fVar40) * (int)fVar49;
      uVar56 = (uint)((int)fVar55 < (int)fVar43) * (int)fVar43 |
               (uint)((int)fVar55 >= (int)fVar43) * (int)fVar55;
      uVar59 = (uint)((int)fVar58 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar58 >= (int)fVar45) * (int)fVar58;
      uVar62 = (uint)((int)fVar61 < (int)fVar47) * (int)fVar47 |
               (uint)((int)fVar61 >= (int)fVar47) * (int)fVar61;
      pfVar1 = (float *)(uVar33 + 0x20 + uVar38);
      fVar40 = (*pfVar1 - fVar7) * fVar10;
      fVar43 = (pfVar1[1] - fVar7) * fVar10;
      fVar45 = (pfVar1[2] - fVar7) * fVar10;
      fVar47 = (pfVar1[3] - fVar7) * fVar10;
      uVar41 = (uint)((int)fVar40 < iVar11) * iVar11 | (uint)((int)fVar40 >= iVar11) * (int)fVar40;
      uVar44 = (uint)((int)fVar43 < iVar11) * iVar11 | (uint)((int)fVar43 >= iVar11) * (int)fVar43;
      uVar46 = (uint)((int)fVar45 < iVar11) * iVar11 | (uint)((int)fVar45 >= iVar11) * (int)fVar45;
      uVar48 = (uint)((int)fVar47 < iVar11) * iVar11 | (uint)((int)fVar47 >= iVar11) * (int)fVar47;
      pfVar1 = (float *)(uVar33 + 0x20 + uVar37);
      fVar40 = (*pfVar1 - fVar5) * fVar8;
      fVar43 = (pfVar1[1] - fVar5) * fVar8;
      fVar45 = (pfVar1[2] - fVar5) * fVar8;
      fVar47 = (pfVar1[3] - fVar5) * fVar8;
      pfVar1 = (float *)(uVar33 + 0x20 + (uVar35 ^ 0x10));
      fVar49 = (*pfVar1 - fVar6) * fVar9;
      fVar55 = (pfVar1[1] - fVar6) * fVar9;
      fVar58 = (pfVar1[2] - fVar6) * fVar9;
      fVar61 = (pfVar1[3] - fVar6) * fVar9;
      uVar64 = (uint)((int)fVar40 < (int)fVar49) * (int)fVar40 |
               (uint)((int)fVar40 >= (int)fVar49) * (int)fVar49;
      uVar66 = (uint)((int)fVar43 < (int)fVar55) * (int)fVar43 |
               (uint)((int)fVar43 >= (int)fVar55) * (int)fVar55;
      uVar69 = (uint)((int)fVar45 < (int)fVar58) * (int)fVar45 |
               (uint)((int)fVar45 >= (int)fVar58) * (int)fVar58;
      uVar72 = (uint)((int)fVar47 < (int)fVar61) * (int)fVar47 |
               (uint)((int)fVar47 >= (int)fVar61) * (int)fVar61;
      pfVar1 = (float *)(uVar33 + 0x20 + (uVar38 ^ 0x10));
      fVar40 = (*pfVar1 - fVar7) * fVar10;
      fVar43 = (pfVar1[1] - fVar7) * fVar10;
      fVar45 = (pfVar1[2] - fVar7) * fVar10;
      fVar47 = (pfVar1[3] - fVar7) * fVar10;
      uVar51 = (uint)(iVar12 < (int)fVar40) * iVar12 | (uint)(iVar12 >= (int)fVar40) * (int)fVar40;
      uVar57 = (uint)(iVar12 < (int)fVar43) * iVar12 | (uint)(iVar12 >= (int)fVar43) * (int)fVar43;
      uVar60 = (uint)(iVar12 < (int)fVar45) * iVar12 | (uint)(iVar12 >= (int)fVar45) * (int)fVar45;
      uVar63 = (uint)(iVar12 < (int)fVar47) * iVar12 | (uint)(iVar12 >= (int)fVar47) * (int)fVar47;
      auVar53._0_4_ =
           -(uint)((int)(((int)uVar64 < (int)uVar51) * uVar64 |
                        ((int)uVar64 >= (int)uVar51) * uVar51) <
                  (int)(((int)uVar41 < (int)uVar50) * uVar50 | ((int)uVar41 >= (int)uVar50) * uVar41
                       ));
      auVar53._4_4_ =
           -(uint)((int)(((int)uVar66 < (int)uVar57) * uVar66 |
                        ((int)uVar66 >= (int)uVar57) * uVar57) <
                  (int)(((int)uVar44 < (int)uVar56) * uVar56 | ((int)uVar44 >= (int)uVar56) * uVar44
                       ));
      auVar53._8_4_ =
           -(uint)((int)(((int)uVar69 < (int)uVar60) * uVar69 |
                        ((int)uVar69 >= (int)uVar60) * uVar60) <
                  (int)(((int)uVar46 < (int)uVar59) * uVar59 | ((int)uVar46 >= (int)uVar59) * uVar46
                       ));
      auVar53._12_4_ =
           -(uint)((int)(((int)uVar72 < (int)uVar63) * uVar72 |
                        ((int)uVar72 >= (int)uVar63) * uVar63) <
                  (int)(((int)uVar48 < (int)uVar62) * uVar62 | ((int)uVar48 >= (int)uVar62) * uVar48
                       ));
      uVar41 = movmskps((int)root.ptr,auVar53);
      root.ptr = (size_t)uVar41;
      if (uVar41 == 0xf) {
        bVar39 = local_9f8 != stack;
        goto joined_r0x0024c31b;
      }
      bVar34 = (byte)uVar41 ^ 0xf;
      uVar32 = uVar33 & 0xfffffffffffffff0;
      lVar16 = 0;
      if (bVar34 != 0) {
        for (; (bVar34 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
        }
      }
      uVar33 = *(ulong *)(uVar32 + lVar16 * 8);
      uVar41 = bVar34 - 1 & (uint)bVar34;
      root.ptr = (size_t)uVar41;
      if (uVar41 != 0) {
        local_9f8->ptr = uVar33;
        local_9f8 = local_9f8 + 1;
        lVar16 = 0;
        if (root.ptr != 0) {
          for (; (uVar41 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
        uVar33 = *(ulong *)(uVar32 + lVar16 * 8);
        uVar41 = uVar41 - 1 & uVar41;
        uVar36 = (ulong)uVar41;
        if (uVar41 != 0) {
          do {
            local_9f8->ptr = uVar33;
            local_9f8 = local_9f8 + 1;
            root.ptr = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> root.ptr & 1) == 0; root.ptr = root.ptr + 1) {
              }
            }
            uVar33 = *(ulong *)(uVar32 + root.ptr * 8);
            uVar36 = uVar36 & uVar36 - 1;
          } while (uVar36 != 0);
        }
      }
    }
    local_a08 = (ulong)((uint)uVar33 & 0xf) - 8;
    if (local_a08 != 0) {
      uVar32 = uVar33 & 0xfffffffffffffff0;
      local_a10 = 0;
      do {
        root.ptr = local_a10 * 0xb0;
        pfVar1 = (float *)(uVar32 + 0x80 + root.ptr);
        fVar58 = *pfVar1;
        fVar61 = pfVar1[1];
        fVar84 = pfVar1[2];
        fVar85 = pfVar1[3];
        pfVar1 = (float *)(uVar32 + 0x40 + root.ptr);
        fVar86 = *pfVar1;
        fVar93 = pfVar1[1];
        fVar95 = pfVar1[2];
        fVar97 = pfVar1[3];
        pfVar1 = (float *)(uVar32 + 0x70 + root.ptr);
        fVar91 = *pfVar1;
        fVar81 = pfVar1[1];
        fVar82 = pfVar1[2];
        fVar83 = pfVar1[3];
        pfVar1 = (float *)(uVar32 + 0x50 + root.ptr);
        fVar68 = *pfVar1;
        fVar71 = pfVar1[1];
        fVar74 = pfVar1[2];
        fVar23 = pfVar1[3];
        fVar65 = fVar91 * fVar68 - fVar58 * fVar86;
        fVar67 = fVar81 * fVar71 - fVar61 * fVar93;
        fVar70 = fVar82 * fVar74 - fVar84 * fVar95;
        fVar73 = fVar83 * fVar23 - fVar85 * fVar97;
        pfVar1 = (float *)(uVar32 + 0x60 + root.ptr);
        fVar24 = *pfVar1;
        fVar25 = pfVar1[1];
        fVar26 = pfVar1[2];
        fVar27 = pfVar1[3];
        pfVar4 = (float *)(uVar32 + root.ptr);
        pfVar1 = (float *)(uVar32 + 0x10 + root.ptr);
        pfVar2 = (float *)(uVar32 + 0x20 + root.ptr);
        pfVar3 = (float *)(uVar32 + 0x30 + root.ptr);
        fVar28 = *pfVar3;
        fVar29 = pfVar3[1];
        fVar30 = pfVar3[2];
        fVar31 = pfVar3[3];
        local_888[0] = fVar58 * fVar28 - fVar68 * fVar24;
        local_888[1] = fVar61 * fVar29 - fVar71 * fVar25;
        local_888[2] = fVar84 * fVar30 - fVar74 * fVar26;
        local_888[3] = fVar85 * fVar31 - fVar23 * fVar27;
        fVar40 = *(float *)(ray + k * 4);
        fVar43 = *(float *)(ray + k * 4 + 0x20);
        fVar45 = *(float *)(ray + k * 4 + 0x40);
        fVar75 = *pfVar4 - fVar40;
        fVar76 = pfVar4[1] - fVar40;
        fVar77 = pfVar4[2] - fVar40;
        fVar40 = pfVar4[3] - fVar40;
        fVar87 = *pfVar2 - fVar43;
        fVar88 = pfVar2[1] - fVar43;
        fVar89 = pfVar2[2] - fVar43;
        fVar43 = pfVar2[3] - fVar43;
        fVar47 = *(float *)(ray + k * 4 + 0x60);
        fVar102 = fVar45 * fVar87 - fVar75 * fVar47;
        fVar103 = fVar45 * fVar88 - fVar76 * fVar47;
        fVar104 = fVar45 * fVar89 - fVar77 * fVar47;
        fVar105 = fVar45 * fVar43 - fVar40 * fVar47;
        local_878[0] = fVar86 * fVar24 - fVar91 * fVar28;
        local_878[1] = fVar93 * fVar25 - fVar81 * fVar29;
        local_878[2] = fVar95 * fVar26 - fVar82 * fVar30;
        local_878[3] = fVar97 * fVar27 - fVar83 * fVar31;
        fVar49 = *(float *)(ray + k * 4 + 0x10);
        fVar78 = *pfVar1 - fVar49;
        fVar79 = pfVar1[1] - fVar49;
        fVar80 = pfVar1[2] - fVar49;
        fVar49 = pfVar1[3] - fVar49;
        fVar55 = *(float *)(ray + k * 4 + 0x50);
        fVar90 = fVar47 * fVar78 - fVar55 * fVar87;
        fVar92 = fVar47 * fVar79 - fVar55 * fVar88;
        fVar94 = fVar47 * fVar80 - fVar55 * fVar89;
        fVar96 = fVar47 * fVar49 - fVar55 * fVar43;
        fVar106 = fVar55 * fVar75 - fVar45 * fVar78;
        fVar107 = fVar55 * fVar76 - fVar45 * fVar79;
        fVar108 = fVar55 * fVar77 - fVar45 * fVar80;
        fVar109 = fVar55 * fVar40 - fVar45 * fVar49;
        fVar98 = fVar47 * local_878[0] + local_888[0] * fVar55 + fVar65 * fVar45;
        fVar99 = fVar47 * local_878[1] + local_888[1] * fVar55 + fVar67 * fVar45;
        fVar100 = fVar47 * local_878[2] + local_888[2] * fVar55 + fVar70 * fVar45;
        fVar101 = fVar47 * local_878[3] + local_888[3] * fVar55 + fVar73 * fVar45;
        uVar44 = (uint)fVar98 & 0x80000000;
        uVar46 = (uint)fVar99 & 0x80000000;
        uVar48 = (uint)fVar100 & 0x80000000;
        uVar50 = (uint)fVar101 & 0x80000000;
        fVar45 = (float)((uint)(fVar24 * fVar90 + fVar91 * fVar102 + fVar58 * fVar106) ^ uVar44);
        fVar47 = (float)((uint)(fVar25 * fVar92 + fVar81 * fVar103 + fVar61 * fVar107) ^ uVar46);
        fVar55 = (float)((uint)(fVar26 * fVar94 + fVar82 * fVar104 + fVar84 * fVar108) ^ uVar48);
        fVar58 = (float)((uint)(fVar27 * fVar96 + fVar83 * fVar105 + fVar85 * fVar109) ^ uVar50);
        fVar91 = (float)((uint)(fVar90 * fVar28 + fVar102 * fVar86 + fVar106 * fVar68) ^ uVar44);
        fVar93 = (float)((uint)(fVar92 * fVar29 + fVar103 * fVar93 + fVar107 * fVar71) ^ uVar46);
        fVar95 = (float)((uint)(fVar94 * fVar30 + fVar104 * fVar95 + fVar108 * fVar74) ^ uVar48);
        fVar97 = (float)((uint)(fVar96 * fVar31 + fVar105 * fVar97 + fVar109 * fVar23) ^ uVar50);
        fVar61 = ABS(fVar98);
        fVar84 = ABS(fVar99);
        fVar85 = ABS(fVar100);
        fVar86 = ABS(fVar101);
        bVar21 = fVar45 + fVar91 <= fVar61 && ((0.0 <= fVar91 && 0.0 <= fVar45) && fVar98 != 0.0);
        bVar22 = fVar47 + fVar93 <= fVar84 && ((0.0 <= fVar93 && 0.0 <= fVar47) && fVar99 != 0.0);
        bVar20 = fVar55 + fVar95 <= fVar85 && ((0.0 <= fVar95 && 0.0 <= fVar55) && fVar100 != 0.0);
        bVar19 = fVar58 + fVar97 <= fVar86 && ((0.0 <= fVar97 && 0.0 <= fVar58) && fVar101 != 0.0);
        auVar18._4_4_ = -(uint)bVar22;
        auVar18._0_4_ = -(uint)bVar21;
        auVar18._8_4_ = -(uint)bVar20;
        auVar18._12_4_ = -(uint)bVar19;
        uVar41 = movmskps((int)uVar33,auVar18);
        uVar33 = (ulong)uVar41;
        if (uVar41 != 0) {
          fVar81 = (float)(uVar44 ^ (uint)(fVar75 * fVar65 +
                                          fVar78 * local_888[0] + fVar87 * local_878[0]));
          fVar82 = (float)(uVar46 ^ (uint)(fVar76 * fVar67 +
                                          fVar79 * local_888[1] + fVar88 * local_878[1]));
          fVar83 = (float)(uVar48 ^ (uint)(fVar77 * fVar70 +
                                          fVar80 * local_888[2] + fVar89 * local_878[2]));
          fVar49 = (float)(uVar50 ^ (uint)(fVar40 * fVar73 +
                                          fVar49 * local_888[3] + fVar43 * local_878[3]));
          fVar40 = *(float *)(ray + k * 4 + 0x30);
          fVar43 = *(float *)(ray + k * 4 + 0x80);
          auVar52._0_4_ = -(uint)((fVar81 <= fVar43 * fVar61 && fVar40 * fVar61 < fVar81) && bVar21)
          ;
          auVar52._4_4_ = -(uint)((fVar82 <= fVar43 * fVar84 && fVar40 * fVar84 < fVar82) && bVar22)
          ;
          auVar52._8_4_ = -(uint)((fVar83 <= fVar43 * fVar85 && fVar40 * fVar85 < fVar83) && bVar20)
          ;
          auVar52._12_4_ =
               -(uint)((fVar49 <= fVar43 * fVar86 && fVar40 * fVar86 < fVar49) && bVar19);
          uVar41 = movmskps(uVar41,auVar52);
          uVar33 = (ulong)uVar41;
          if (uVar41 != 0) {
            root.ptr = root.ptr + uVar32;
            local_898._4_4_ = fVar67;
            local_898._0_4_ = fVar65;
            local_898._8_4_ = fVar70;
            local_898._12_4_ = fVar73;
            pSVar13 = context->scene;
            auVar17._4_4_ = fVar84;
            auVar17._0_4_ = fVar61;
            auVar17._8_4_ = fVar85;
            auVar17._12_4_ = fVar86;
            auVar53 = rcpps(local_898,auVar17);
            fVar40 = auVar53._0_4_;
            fVar68 = auVar53._4_4_;
            fVar71 = auVar53._8_4_;
            fVar74 = auVar53._12_4_;
            fVar40 = (1.0 - fVar61 * fVar40) * fVar40 + fVar40;
            fVar68 = (1.0 - fVar84 * fVar68) * fVar68 + fVar68;
            fVar71 = (1.0 - fVar85 * fVar71) * fVar71 + fVar71;
            fVar74 = (1.0 - fVar86 * fVar74) * fVar74 + fVar74;
            local_8a8[0] = fVar81 * fVar40;
            local_8a8[1] = fVar82 * fVar68;
            local_8a8[2] = fVar83 * fVar71;
            local_8a8[3] = fVar49 * fVar74;
            local_8c8._0_4_ = fVar45 * fVar40;
            local_8c8._4_4_ = fVar47 * fVar68;
            local_8c8._8_4_ = fVar55 * fVar71;
            local_8c8._12_4_ = fVar58 * fVar74;
            local_8b8._0_4_ = fVar40 * fVar91;
            local_8b8._4_4_ = fVar68 * fVar93;
            local_8b8._8_4_ = fVar71 * fVar95;
            local_8b8._12_4_ = fVar74 * fVar97;
            uVar33 = (ulong)(byte)uVar41;
            do {
              uVar36 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              local_808 = *(uint *)(root.ptr + 0x90 + uVar36 * 4);
              pGVar14 = (pSVar13->geometries).items[local_808].ptr;
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0024c960:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar39;
                }
                local_838 = *(undefined4 *)(local_8c8 + uVar36 * 4);
                fVar40 = local_8a8[uVar36 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar36];
                args.context = context->user;
                local_818 = *(undefined4 *)(root.ptr + 0xa0 + uVar36 * 4);
                local_828._4_4_ = fVar40;
                local_828._0_4_ = fVar40;
                local_828._8_4_ = fVar40;
                local_828._12_4_ = fVar40;
                local_868 = local_888[uVar36 - 4];
                local_858 = local_888[uVar36];
                local_848 = local_878[uVar36];
                fStack_864 = local_868;
                fStack_860 = local_868;
                fStack_85c = local_868;
                fStack_854 = local_858;
                fStack_850 = local_858;
                fStack_84c = local_858;
                fStack_844 = local_848;
                fStack_840 = local_848;
                fStack_83c = local_848;
                uStack_834 = local_838;
                uStack_830 = local_838;
                uStack_82c = local_838;
                uStack_814 = local_818;
                uStack_810 = local_818;
                uStack_80c = local_818;
                uStack_804 = local_808;
                uStack_800 = local_808;
                uStack_7fc = local_808;
                local_7f8 = (args.context)->instID[0];
                uStack_7f4 = local_7f8;
                uStack_7f0 = local_7f8;
                uStack_7ec = local_7f8;
                local_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = local_7e8;
                uStack_7e0 = local_7e8;
                uStack_7dc = local_7e8;
                local_a28 = *local_9f0;
                args.valid = (int *)local_a28;
                args.geometryUserPtr = pGVar14->userPtr;
                args.hit = (RTCHitN *)&local_868;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar14->occlusionFilterN)(&args);
                }
                if (local_a28 == (undefined1  [16])0x0) {
                  auVar54._8_4_ = 0xffffffff;
                  auVar54._0_8_ = 0xffffffffffffffff;
                  auVar54._12_4_ = 0xffffffff;
                  auVar54 = auVar54 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var15 = context->args->filter;
                  if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var15)(&args);
                  }
                  auVar42._0_4_ = -(uint)(local_a28._0_4_ == 0);
                  auVar42._4_4_ = -(uint)(local_a28._4_4_ == 0);
                  auVar42._8_4_ = -(uint)(local_a28._8_4_ == 0);
                  auVar42._12_4_ = -(uint)(local_a28._12_4_ == 0);
                  auVar54 = auVar42 ^ _DAT_01f7ae20;
                  auVar53 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar42);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar53;
                }
                if ((_DAT_01f7bb20 & auVar54) != (undefined1  [16])0x0) goto LAB_0024c960;
                *(float *)(ray + k * 4 + 0x80) = fVar43;
              }
              uVar33 = uVar33 ^ 1L << (uVar36 & 0x3f);
            } while (uVar33 != 0);
            uVar33 = 0;
          }
        }
        local_a10 = local_a10 + 1;
      } while (local_a10 != local_a08);
    }
    bVar39 = local_9f8 != stack;
joined_r0x0024c31b:
    if (!bVar39) {
      return bVar39;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }